

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O2

void __thiscall
amrex::YAFluxRegister::CrseAdd
          (YAFluxRegister *this,MFIter *mfi,array<const_amrex::FArrayBox_*,_3UL> *flux,Real *dx,
          Real dt,RunOn runon)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  FArrayBox *pFVar12;
  FArrayBox *pFVar13;
  FArrayBox *pFVar14;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  double *pdVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  undefined8 in_XMM0_Qb;
  Array4<double> fab;
  Array4<int> flag;
  Array4<double> local_248;
  long local_208;
  long local_200;
  double local_1a8;
  undefined8 uStack_1a0;
  long local_198;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  Box local_8c;
  Array4<int> local_70;
  
  piVar15 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar15 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar15;
  }
  if ((this->m_crse_fab_flag).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [*piVar15] != 0) {
    local_1a8 = dt;
    uStack_1a0 = in_XMM0_Qb;
    MFIter::tilebox(&local_8c,mfi);
    local_a8 = local_1a8 / *dx;
    uStack_a0 = uStack_1a0;
    local_b8 = local_1a8 / dx[1];
    uStack_b0 = uStack_1a0;
    local_1a8 = local_1a8 / dx[2];
    uVar2 = (this->m_crse_data).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp;
    pFVar12 = flux->_M_elems[0];
    pFVar13 = flux->_M_elems[1];
    pFVar14 = flux->_M_elems[2];
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_248,(FabArray<amrex::FArrayBox> *)this,mfi);
    FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
              (&local_70,&(this->m_crse_flag).super_FabArray<amrex::IArrayBox>,mfi);
    iVar3 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[0];
    iVar4 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[1];
    iVar5 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[2];
    iVar6 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[0];
    iVar7 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[1];
    iVar8 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[2];
    iVar9 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[0];
    iVar10 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[1];
    iVar11 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[2];
    uVar16 = 0;
    if (0 < (int)uVar2) {
      uVar16 = (ulong)uVar2;
    }
    lVar23 = (long)local_8c.smallend.vect[2];
    lVar22 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
    lVar33 = (long)local_8c.smallend.vect[1] * 8;
    lVar32 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
    lVar17 = (lVar33 + (lVar23 - iVar5) * lVar22 * 8 + (long)iVar4 * -8) * lVar32 + (long)iVar3 * -8
    ;
    lVar22 = lVar22 * lVar32;
    lVar1 = lVar22 * 8;
    lVar22 = lVar22 * (((pFVar12->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
    pdVar21 = (pFVar12->super_BaseFab<double>).dptr;
    lVar27 = (long)pdVar21 + lVar17;
    lVar18 = (long)pdVar21 + lVar17 + 8;
    lVar34 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1);
    lVar28 = lVar33 + (lVar23 - iVar8) * lVar34 * 8 + (long)iVar7 * -8;
    lVar39 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
    lVar34 = lVar34 * lVar39;
    lVar17 = lVar34 * 8;
    lVar34 = lVar34 * (((pFVar13->super_BaseFab<double>).domain.bigend.vect[2] - iVar8) + 1);
    pdVar21 = (pFVar13->super_BaseFab<double>).dptr;
    lVar30 = lVar28 * lVar39 + (long)iVar6 * -8 + (long)pdVar21;
    lVar29 = (lVar28 + 8) * lVar39 + (long)iVar6 * -8 + (long)pdVar21;
    lVar24 = lVar23 - iVar11;
    lVar35 = (long)(((pFVar14->super_BaseFab<double>).domain.bigend.vect[0] - iVar9) + 1);
    lVar37 = (long)(((pFVar14->super_BaseFab<double>).domain.bigend.vect[1] - iVar10) + 1);
    lVar28 = lVar37 * lVar35 * 8;
    lVar38 = lVar37 * lVar35 *
             (long)(((pFVar14->super_BaseFab<double>).domain.bigend.vect[2] - iVar11) + 1);
    pdVar21 = (pFVar14->super_BaseFab<double>).dptr;
    lVar31 = (lVar33 + lVar24 * lVar37 * 8 + (long)iVar10 * -8) * lVar35 + (long)iVar9 * -8 +
             (long)pdVar21;
    local_198 = (lVar33 + (lVar24 + 1) * lVar37 * 8 + (long)iVar10 * -8) * lVar35 + (long)iVar9 * -8
                + (long)pdVar21;
    while (lVar23 <= local_8c.bigend.vect[2]) {
      lVar24 = (lVar23 - local_70.begin.z) * local_70.kstride;
      local_200 = local_198;
      lVar33 = (long)local_8c.smallend.vect[1];
      local_208 = lVar31;
      local_188 = lVar27;
      local_180 = lVar18;
      local_178 = lVar30;
      local_170 = lVar29;
      while (lVar33 <= local_8c.bigend.vect[1]) {
        lVar19 = (lVar33 - local_70.begin.y) * local_70.jstride;
        lVar37 = (long)local_8c.smallend.vect[0];
        while (lVar36 = lVar37, lVar36 <= local_8c.bigend.vect[0]) {
          lVar25 = lVar36 - local_70.begin.x;
          if (local_70.p[lVar19 + lVar25 + lVar24] == 1) {
            if (local_70.p[lVar19 + lVar24 + (~local_70.begin.x + (int)lVar36)] == 2) {
              pdVar26 = local_248.p +
                        ((lVar36 + (lVar23 - local_248.begin.z) * local_248.kstride +
                                   (lVar33 - local_248.begin.y) * local_248.jstride) -
                        (long)local_248.begin.x);
              pdVar21 = (double *)(local_188 + lVar36 * 8);
              uVar20 = uVar16;
              while (bVar40 = uVar20 != 0, uVar20 = uVar20 - 1, bVar40) {
                *pdVar26 = *pdVar21 * -local_a8 + *pdVar26;
                pdVar26 = pdVar26 + local_248.nstride;
                pdVar21 = pdVar21 + lVar22;
              }
            }
            lVar37 = lVar36 + 1;
            if (local_70.p[lVar19 + lVar24 + (lVar37 - local_70.begin.x)] == 2) {
              pdVar26 = local_248.p +
                        ((lVar36 + (lVar23 - local_248.begin.z) * local_248.kstride +
                                   (lVar33 - local_248.begin.y) * local_248.jstride) -
                        (long)local_248.begin.x);
              pdVar21 = (double *)(local_180 + lVar36 * 8);
              uVar20 = uVar16;
              while (bVar40 = uVar20 != 0, uVar20 = uVar20 - 1, bVar40) {
                *pdVar26 = *pdVar21 * local_a8 + *pdVar26;
                pdVar26 = pdVar26 + local_248.nstride;
                pdVar21 = pdVar21 + lVar22;
              }
            }
            if (local_70.p[lVar24 + (~local_70.begin.y + (int)lVar33) * local_70.jstride + lVar25]
                == 2) {
              pdVar26 = local_248.p +
                        ((lVar36 + (lVar23 - local_248.begin.z) * local_248.kstride +
                                   (lVar33 - local_248.begin.y) * local_248.jstride) -
                        (long)local_248.begin.x);
              pdVar21 = (double *)(local_178 + lVar36 * 8);
              uVar20 = uVar16;
              while (bVar40 = uVar20 != 0, uVar20 = uVar20 - 1, bVar40) {
                *pdVar26 = *pdVar21 * -local_b8 + *pdVar26;
                pdVar26 = pdVar26 + local_248.nstride;
                pdVar21 = pdVar21 + lVar34;
              }
            }
            if (local_70.p
                [lVar24 + ((lVar33 + 1) - (long)local_70.begin.y) * local_70.jstride + lVar25] == 2)
            {
              pdVar26 = local_248.p +
                        ((lVar36 + (lVar23 - local_248.begin.z) * local_248.kstride +
                                   (lVar33 - local_248.begin.y) * local_248.jstride) -
                        (long)local_248.begin.x);
              pdVar21 = (double *)(local_170 + lVar36 * 8);
              uVar20 = uVar16;
              while (bVar40 = uVar20 != 0, uVar20 = uVar20 - 1, bVar40) {
                *pdVar26 = *pdVar21 * local_b8 + *pdVar26;
                pdVar26 = pdVar26 + local_248.nstride;
                pdVar21 = pdVar21 + lVar34;
              }
            }
            if (local_70.p[lVar19 + lVar25 + (~local_70.begin.z + (int)lVar23) * local_70.kstride]
                == 2) {
              pdVar26 = local_248.p +
                        ((lVar36 + (lVar23 - local_248.begin.z) * local_248.kstride +
                                   (lVar33 - local_248.begin.y) * local_248.jstride) -
                        (long)local_248.begin.x);
              pdVar21 = (double *)(local_208 + lVar36 * 8);
              uVar20 = uVar16;
              while (bVar40 = uVar20 != 0, uVar20 = uVar20 - 1, bVar40) {
                *pdVar26 = *pdVar21 * -local_1a8 + *pdVar26;
                pdVar26 = pdVar26 + local_248.nstride;
                pdVar21 = pdVar21 + lVar38;
              }
            }
            if (local_70.p
                [lVar19 + lVar25 + ((lVar23 + 1) - (long)local_70.begin.z) * local_70.kstride] == 2)
            {
              pdVar26 = local_248.p +
                        ((lVar36 + (lVar23 - local_248.begin.z) * local_248.kstride +
                                   (lVar33 - local_248.begin.y) * local_248.jstride) -
                        (long)local_248.begin.x);
              pdVar21 = (double *)(local_200 + lVar36 * 8);
              uVar20 = uVar16;
              while (bVar40 = uVar20 != 0, uVar20 = uVar20 - 1, bVar40) {
                *pdVar26 = *pdVar21 * local_1a8 + *pdVar26;
                pdVar26 = pdVar26 + local_248.nstride;
                pdVar21 = pdVar21 + lVar38;
              }
            }
          }
          else {
            lVar37 = lVar36 + 1;
          }
        }
        local_188 = local_188 + lVar32 * 8;
        local_180 = local_180 + lVar32 * 8;
        local_178 = local_178 + lVar39 * 8;
        local_170 = local_170 + lVar39 * 8;
        local_208 = local_208 + lVar35 * 8;
        local_200 = local_200 + lVar35 * 8;
        lVar33 = lVar33 + 1;
      }
      lVar27 = lVar27 + lVar1;
      lVar18 = lVar18 + lVar1;
      lVar30 = lVar30 + lVar17;
      lVar29 = lVar29 + lVar17;
      lVar31 = lVar31 + lVar28;
      local_198 = local_198 + lVar28;
      lVar23 = lVar23 + 1;
    }
  }
  return;
}

Assistant:

void
YAFluxRegister::CrseAdd (const MFIter& mfi,
                         const std::array<FArrayBox const*, AMREX_SPACEDIM>& flux,
                         const Real* dx, Real dt, RunOn runon) noexcept
{
    BL_ASSERT(m_crse_data.nComp() == flux[0]->nComp());

    if (m_crse_fab_flag[mfi.LocalIndex()] == crse_cell) {
        return;  // this coarse fab is not close to fine fabs.
    }

    const Box& bx = mfi.tilebox();
    const int nc = m_crse_data.nComp();
    AMREX_D_TERM(const Real dtdx = dt/dx[0];,
                 const Real dtdy = dt/dx[1];,
                 const Real dtdz = dt/dx[2];);
    AMREX_D_TERM(FArrayBox const* fx = flux[0];,
                 FArrayBox const* fy = flux[1];,
                 FArrayBox const* fz = flux[2];);

    auto fab = m_crse_data.array(mfi);
    auto const flag = m_crse_flag.array(mfi);

    AMREX_D_TERM(Array4<Real const> fxarr = fx->const_array();,
                 Array4<Real const> fyarr = fy->const_array();,
                 Array4<Real const> fzarr = fz->const_array(););

    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG ( runon, bx, tbx,
    {
        yafluxreg_crseadd(tbx, fab, flag, AMREX_D_DECL(fxarr,fyarr,fzarr),
                          AMREX_D_DECL(dtdx,dtdy,dtdz),nc);
    });
}